

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O2

void __thiscall
HawkTracer::client::CallgrindConverter::_print_function
          (CallgrindConverter *this,ofstream *file,
          shared_ptr<HawkTracer::client::CallGraph::TreeNode> *root)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  element_type *peVar1;
  pointer ppVar2;
  _Elt_pointer ppVar3;
  ostream *poVar4;
  pointer __args;
  string child_label;
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  fnc_queue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  queue<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>>
  ::
  queue<std::deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>,void>
            (&local_a0);
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (root->
                 super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr,"()");
  std::
  deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>&,std::__cxx11::string>
            ((deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
              *)&local_a0,root,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  while (ppVar3 = local_a0.c.
                  super__Deque_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        local_a0.c.
        super__Deque_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_a0.c.
        super__Deque_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    poVar4 = std::operator<<((ostream *)file,"fn=");
    __rhs = &ppVar3->second;
    poVar4 = std::operator<<(poVar4,(string *)__rhs);
    std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<((ostream *)file,"1 ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,"\n");
    peVar1 = (ppVar3->first).
             super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ppVar2 = *(pointer *)
              ((long)&(peVar1->children).
                      super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (__args = (peVar1->children).
                  super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != ppVar2; __args = __args + 1)
    {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (__args->first).
                     super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,"()\'");
      std::operator+(&local_c0,&local_50,__rhs);
      std::__cxx11::string::~string((string *)&local_50);
      poVar4 = std::operator<<((ostream *)file,"cfn=");
      poVar4 = std::operator<<(poVar4,(string *)&local_c0);
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<((ostream *)file,"calls=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,__args->second);
      std::operator<<(poVar4," 1\n");
      poVar4 = std::operator<<((ostream *)file,"1 ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"\n");
      std::
      deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
      ::
      emplace_back<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>const&,std::__cxx11::string&>
                ((deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,std::__cxx11::string>>>
                  *)&local_a0,&__args->first,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::
    deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop_front(&local_a0.c);
  }
  std::
  deque<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque(&local_a0.c);
  return;
}

Assistant:

void CallgrindConverter::_print_function(std::ofstream& file, std::shared_ptr<CallGraph::TreeNode> root)
{
    std::queue<std::pair<std::shared_ptr<CallGraph::TreeNode>, std::string>> fnc_queue;
    fnc_queue.emplace(root, root->data.label + "()");

    while (!fnc_queue.empty())
    {
        auto& fnc = fnc_queue.front();
        file << "fn=" << fnc.second << "\n";
        file << "1 " << fnc.first->total_duration - fnc.first->total_children_duration << "\n";
        for (const auto& child : fnc.first->children)
        {
            std::string child_label = child.first->data.label + "()'" + fnc.second;
            file << "cfn=" << child_label << "\n";
            file << "calls=" << child.second << " 1\n";
            file << "1 " << child.first->total_duration << "\n";
            fnc_queue.emplace(child.first, child_label);
        }
        fnc_queue.pop();
    }
}